

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Loop.cc
# Opt level: O1

void __thiscall
RigidBodyDynamics::LoopConstraint::calcVelocityError
          (LoopConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *QDot,MatrixNd *GSys,
          VectorNd *derrSysUpd,ConstraintCache *cache,bool updateKinematics)

{
  uint uVar1;
  double *pdVar2;
  _Bit_type *p_Var3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  double *pdVar13;
  double dVar14;
  
  uVar8 = (ulong)(this->super_Constraint).sizeOfConstraint;
  if (uVar8 != 0) {
    uVar1 = (this->super_Constraint).rowInSystem;
    pdVar2 = (derrSysUpd->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    p_Var3 = (this->super_Constraint).velocityConstraint.super__Bvector_base<std::allocator<bool>_>.
             _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lVar4 = (GSys->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols;
    pdVar5 = (GSys->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar6 = (GSys->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
    pdVar7 = (QDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    uVar10 = 0;
    uVar9 = uVar1;
    do {
      uVar12 = uVar1 + (int)uVar10;
      pdVar2[uVar12] = 0.0;
      if ((p_Var3[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0 && 0 < lVar4) {
        pdVar13 = pdVar5 + uVar9;
        dVar14 = pdVar2[uVar12];
        uVar11 = 0;
        do {
          dVar14 = dVar14 + *pdVar13 * pdVar7[uVar11];
          pdVar2[uVar12] = dVar14;
          uVar11 = uVar11 + 1;
          pdVar13 = pdVar13 + lVar6;
        } while ((long)(uVar11 & 0xffffffff) < lVar4);
      }
      uVar10 = uVar10 + 1;
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar8);
  }
  return;
}

Assistant:

void LoopConstraint::calcVelocityError(  Model &model,
                            const double time,
                            const Math::VectorNd &Q,
                            const Math::VectorNd &QDot,
                            const Math::MatrixNd &GSys,
                            Math::VectorNd &derrSysUpd,
                            ConstraintCache &cache,
                            bool updateKinematics)
{
  //SimpleMath cannot handle multiplying a block matrix by a vector
  //Using a for loop here to maintain backwards compatibility.
  //Rant: all of this ugliness for a dot product! Does anyone even use
  //      SimpleMath?

  //derrSysUpd.block(rowInSystem,0,sizeOfConstraint,1) =
  //    GSys.block(rowInSystem,0,sizeOfConstraint,GSys.cols())*QDot;

  for(unsigned int i=0; i<sizeOfConstraint;++i){
    derrSysUpd[rowInSystem+i] = 0;
    if(velocityConstraint[i]){
      for(unsigned int j=0; j<GSys.cols();++j){
        derrSysUpd[rowInSystem+i] +=
             GSys(rowInSystem+i,j)*QDot[j];
      }
    }
  }

}